

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

opj_image_t * tgatoimage(char *filename,opj_cparameters_t *parameters)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  size_t sVar3;
  int local_124;
  int local_120;
  bool local_115;
  bool local_114;
  byte local_113;
  byte local_112;
  byte local_111;
  byte local_110;
  byte local_10f;
  byte local_10e;
  byte local_10d;
  uchar a;
  uchar b_1;
  int iStack_10c;
  uchar g_1;
  uchar r_1;
  uchar b;
  uchar g;
  uchar r;
  int index;
  long curpos;
  OPJ_UINT64 expected_file_size;
  OPJ_UINT32 OStack_f0;
  char ch;
  int i;
  int subsampling_dy;
  int subsampling_dx;
  OPJ_BOOL save_alpha;
  OPJ_BOOL mono;
  OPJ_COLOR_SPACE color_space;
  int numcomps;
  opj_image_cmptparm_t cmptparm [4];
  int flip_image;
  uint y;
  uint x;
  uint pixel_bit_depth;
  uint image_height;
  uint image_width;
  opj_image_t *image;
  FILE *f;
  opj_cparameters_t *parameters_local;
  char *filename_local;
  
  cmptparm[3].bpp = 0;
  f = (FILE *)parameters;
  parameters_local = (opj_cparameters_t *)filename;
  image = (opj_image_t *)fopen(filename,"rb");
  if ((FILE *)image == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !!\n",parameters_local);
    filename_local = (char *)0x0;
  }
  else {
    iVar2 = tga_readheader((FILE *)image,&y,&pixel_bit_depth,&x,(int *)&cmptparm[3].bpp);
    if (iVar2 == 0) {
      fclose((FILE *)image);
      filename_local = (char *)0x0;
    }
    else if ((y == 0x18) || (y == 0x20)) {
      memset(&color_space,0,0x90);
      local_114 = y == 8 || y == 0x10;
      subsampling_dx = (int)local_114;
      local_115 = y == 0x10 || y == 0x20;
      subsampling_dy = (int)local_115;
      if (subsampling_dx == 0) {
        mono = 3;
        if (subsampling_dy != 0) {
          mono = 4;
        }
        save_alpha = 1;
      }
      else {
        save_alpha = 2;
        mono = 1;
        if (subsampling_dy != 0) {
          mono = 2;
        }
      }
      if ((x != 0) && ((uint)((10000000 / (ulong)x) / (ulong)(uint)mono) < pixel_bit_depth)) {
        curpos = (ulong)pixel_bit_depth * (ulong)x * (ulong)(uint)mono;
        _r_1 = ftell((FILE *)image);
        if (0x7fffffff < (ulong)curpos) {
          curpos = 0x7fffffff;
        }
        fseek((FILE *)image,curpos + -1,0);
        sVar3 = fread((void *)((long)&expected_file_size + 3),1,1,(FILE *)image);
        if (sVar3 != 1) {
          fclose((FILE *)image);
          return (opj_image_t *)0x0;
        }
        fseek((FILE *)image,_r_1,0);
      }
      i = *(OPJ_COLOR_SPACE *)((long)&f[0x54]._IO_write_end + 4);
      OStack_f0 = *(OPJ_UINT32 *)&f[0x54]._IO_buf_base;
      for (expected_file_size._4_4_ = 0; expected_file_size._4_4_ < mono;
          expected_file_size._4_4_ = expected_file_size._4_4_ + 1) {
        cmptparm[expected_file_size._4_4_].x0 = 8;
        cmptparm[expected_file_size._4_4_].prec = 0;
        (&color_space)[(long)expected_file_size._4_4_ * 9] = i;
        cmptparm[(long)expected_file_size._4_4_ + -1].sgnd = OStack_f0;
        cmptparm[expected_file_size._4_4_].dx = pixel_bit_depth;
        cmptparm[expected_file_size._4_4_].dy = x;
      }
      _image_height = (int *)opj_image_create(mono,&color_space,save_alpha);
      if (_image_height == (int *)0x0) {
        fclose((FILE *)image);
        filename_local = (char *)0x0;
      }
      else {
        *_image_height = *(int *)((long)&f[0x54]._IO_write_ptr + 4);
        _image_height[1] = *(int *)&f[0x54]._IO_write_end;
        if (*_image_height == 0) {
          local_120 = (pixel_bit_depth - 1) * i;
        }
        else {
          local_120 = *_image_height + (pixel_bit_depth - 1) * i;
        }
        local_120 = local_120 + 1;
        _image_height[2] = local_120;
        if (_image_height[1] == 0) {
          local_124 = (x - 1) * OStack_f0;
        }
        else {
          local_124 = _image_height[1] + (x - 1) * OStack_f0;
        }
        local_124 = local_124 + 1;
        _image_height[3] = local_124;
        for (cmptparm[3].sgnd = 0; cmptparm[3].sgnd < x; cmptparm[3].sgnd = cmptparm[3].sgnd + 1) {
          OVar1 = cmptparm[3].sgnd;
          if (cmptparm[3].bpp != 0) {
            OVar1 = (x - cmptparm[3].sgnd) - 1;
          }
          iStack_10c = OVar1 * pixel_bit_depth;
          if (mono == 3) {
            for (flip_image = 0; (uint)flip_image < pixel_bit_depth; flip_image = flip_image + 1) {
              sVar3 = fread(&local_10f,1,1,(FILE *)image);
              if (sVar3 == 0) {
                fprintf(_stderr,
                        "\nError: fread return a number of element different from the expected.\n");
                opj_image_destroy(_image_height);
                fclose((FILE *)image);
                return (opj_image_t *)0x0;
              }
              sVar3 = fread(&local_10e,1,1,(FILE *)image);
              if (sVar3 == 0) {
                fprintf(_stderr,
                        "\nError: fread return a number of element different from the expected.\n");
                opj_image_destroy(_image_height);
                fclose((FILE *)image);
                return (opj_image_t *)0x0;
              }
              sVar3 = fread(&local_10d,1,1,(FILE *)image);
              if (sVar3 == 0) {
                fprintf(_stderr,
                        "\nError: fread return a number of element different from the expected.\n");
                opj_image_destroy(_image_height);
                fclose((FILE *)image);
                return (opj_image_t *)0x0;
              }
              *(uint *)(*(long *)(*(long *)(_image_height + 6) + 0x30) + (long)iStack_10c * 4) =
                   (uint)local_10d;
              *(uint *)(*(long *)(*(long *)(_image_height + 6) + 0x70) + (long)iStack_10c * 4) =
                   (uint)local_10e;
              *(uint *)(*(long *)(*(long *)(_image_height + 6) + 0xb0) + (long)iStack_10c * 4) =
                   (uint)local_10f;
              iStack_10c = iStack_10c + 1;
            }
          }
          else if (mono == 4) {
            for (flip_image = 0; (uint)flip_image < pixel_bit_depth; flip_image = flip_image + 1) {
              sVar3 = fread(&local_112,1,1,(FILE *)image);
              if (sVar3 == 0) {
                fprintf(_stderr,
                        "\nError: fread return a number of element different from the expected.\n");
                opj_image_destroy(_image_height);
                fclose((FILE *)image);
                return (opj_image_t *)0x0;
              }
              sVar3 = fread(&local_111,1,1,(FILE *)image);
              if (sVar3 == 0) {
                fprintf(_stderr,
                        "\nError: fread return a number of element different from the expected.\n");
                opj_image_destroy(_image_height);
                fclose((FILE *)image);
                return (opj_image_t *)0x0;
              }
              sVar3 = fread(&local_110,1,1,(FILE *)image);
              if (sVar3 == 0) {
                fprintf(_stderr,
                        "\nError: fread return a number of element different from the expected.\n");
                opj_image_destroy(_image_height);
                fclose((FILE *)image);
                return (opj_image_t *)0x0;
              }
              sVar3 = fread(&local_113,1,1,(FILE *)image);
              if (sVar3 == 0) {
                fprintf(_stderr,
                        "\nError: fread return a number of element different from the expected.\n");
                opj_image_destroy(_image_height);
                fclose((FILE *)image);
                return (opj_image_t *)0x0;
              }
              *(uint *)(*(long *)(*(long *)(_image_height + 6) + 0x30) + (long)iStack_10c * 4) =
                   (uint)local_110;
              *(uint *)(*(long *)(*(long *)(_image_height + 6) + 0x70) + (long)iStack_10c * 4) =
                   (uint)local_111;
              *(uint *)(*(long *)(*(long *)(_image_height + 6) + 0xb0) + (long)iStack_10c * 4) =
                   (uint)local_112;
              *(uint *)(*(long *)(*(long *)(_image_height + 6) + 0xf0) + (long)iStack_10c * 4) =
                   (uint)local_113;
              iStack_10c = iStack_10c + 1;
            }
          }
          else {
            fprintf(_stderr,"Currently unsupported bit depth : %s\n",parameters_local);
          }
        }
        fclose((FILE *)image);
        filename_local = (char *)_image_height;
      }
    }
    else {
      fclose((FILE *)image);
      filename_local = (char *)0x0;
    }
  }
  return (opj_image_t *)filename_local;
}

Assistant:

opj_image_t* tgatoimage(const char *filename, opj_cparameters_t *parameters)
{
    FILE *f;
    opj_image_t *image;
    unsigned int image_width, image_height, pixel_bit_depth;
    unsigned int x, y;
    int flip_image = 0;
    opj_image_cmptparm_t cmptparm[4];   /* maximum 4 components */
    int numcomps;
    OPJ_COLOR_SPACE color_space;
    OPJ_BOOL mono ;
    OPJ_BOOL save_alpha;
    int subsampling_dx, subsampling_dy;
    int i;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        return 0;
    }

    if (!tga_readheader(f, &pixel_bit_depth, &image_width, &image_height,
                        &flip_image)) {
        fclose(f);
        return NULL;
    }

    /* We currently only support 24 & 32 bit tga's ... */
    if (!((pixel_bit_depth == 24) || (pixel_bit_depth == 32))) {
        fclose(f);
        return NULL;
    }

    /* initialize image components */
    memset(&cmptparm[0], 0, 4 * sizeof(opj_image_cmptparm_t));

    mono = (pixel_bit_depth == 8) ||
           (pixel_bit_depth == 16);  /* Mono with & without alpha. */
    save_alpha = (pixel_bit_depth == 16) ||
                 (pixel_bit_depth == 32); /* Mono with alpha, or RGB with alpha */

    if (mono) {
        color_space = OPJ_CLRSPC_GRAY;
        numcomps = save_alpha ? 2 : 1;
    } else {
        numcomps = save_alpha ? 4 : 3;
        color_space = OPJ_CLRSPC_SRGB;
    }

    /* If the declared file size is > 10 MB, check that the file is big */
    /* enough to avoid excessive memory allocations */
    if (image_height != 0 &&
            image_width > 10000000U / image_height / (OPJ_UINT32)numcomps) {
        char ch;
        OPJ_UINT64 expected_file_size =
            (OPJ_UINT64)image_width * image_height * (OPJ_UINT32)numcomps;
        long curpos = ftell(f);
        if (expected_file_size > (OPJ_UINT64)INT_MAX) {
            expected_file_size = (OPJ_UINT64)INT_MAX;
        }
        fseek(f, (long)expected_file_size - 1, SEEK_SET);
        if (fread(&ch, 1, 1, f) != 1) {
            fclose(f);
            return NULL;
        }
        fseek(f, curpos, SEEK_SET);
    }

    subsampling_dx = parameters->subsampling_dx;
    subsampling_dy = parameters->subsampling_dy;

    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = 8;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)subsampling_dy;
        cmptparm[i].w = image_width;
        cmptparm[i].h = image_height;
    }

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);

    if (!image) {
        fclose(f);
        return NULL;
    }


    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = !image->x0 ? (OPJ_UINT32)(image_width - 1)  *
                (OPJ_UINT32)subsampling_dx + 1 : image->x0 + (OPJ_UINT32)(image_width - 1)  *
                (OPJ_UINT32)subsampling_dx + 1;
    image->y1 = !image->y0 ? (OPJ_UINT32)(image_height - 1) *
                (OPJ_UINT32)subsampling_dy + 1 : image->y0 + (OPJ_UINT32)(image_height - 1) *
                (OPJ_UINT32)subsampling_dy + 1;

    /* set image data */
    for (y = 0; y < image_height; y++) {
        int index;

        if (flip_image) {
            index = (int)((image_height - y - 1) * image_width);
        } else {
            index = (int)(y * image_width);
        }

        if (numcomps == 3) {
            for (x = 0; x < image_width; x++) {
                unsigned char r, g, b;

                if (!fread(&b, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&g, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&r, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }

                image->comps[0].data[index] = r;
                image->comps[1].data[index] = g;
                image->comps[2].data[index] = b;
                index++;
            }
        } else if (numcomps == 4) {
            for (x = 0; x < image_width; x++) {
                unsigned char r, g, b, a;
                if (!fread(&b, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&g, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&r, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&a, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }

                image->comps[0].data[index] = r;
                image->comps[1].data[index] = g;
                image->comps[2].data[index] = b;
                image->comps[3].data[index] = a;
                index++;
            }
        } else {
            fprintf(stderr, "Currently unsupported bit depth : %s\n", filename);
        }
    }
    fclose(f);
    return image;
}